

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_create_table.cpp
# Opt level: O1

void __thiscall
duckdb::LogicalCreateTable::LogicalCreateTable
          (LogicalCreateTable *this,ClientContext *context,
          unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
          *unbound_info)

{
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  *this_00;
  _Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  __ptr_00;
  undefined8 uVar1;
  pointer pCVar2;
  pointer pCVar3;
  SchemaCatalogEntry *pSVar4;
  Binder *info;
  pointer *__ptr;
  shared_ptr<duckdb::Binder,_true> binder;
  undefined1 local_40 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_CREATE_TABLE);
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalCreateTable_02488818;
  pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (unbound_info);
  pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (unbound_info);
  pSVar4 = Catalog::GetSchema(context,&pCVar2->catalog,&pCVar3->schema);
  this->schema = pSVar4;
  this_00 = &this->info;
  (this->info).
  super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
       (BoundCreateTableInfo *)0x0;
  Binder::CreateBinder
            ((Binder *)&stack0xffffffffffffffd0,context,(optional_ptr<duckdb::Binder,_true>)0x0,
             REGULAR_BINDER);
  info = shared_ptr<duckdb::Binder,_true>::operator->
                   ((shared_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffffd0);
  local_40._8_8_ =
       (unbound_info->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
       )._M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
       super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
  (unbound_info->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>).
  _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
  Binder::BindCreateTableInfo
            ((Binder *)local_40,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)info);
  uVar1 = local_40._0_8_;
  local_40._0_8_ = (element_type *)0x0;
  __ptr_00.super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>;
  (this_00->
  super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false> =
       (_Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>)uVar1;
  if (__ptr_00.super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl !=
      (BoundCreateTableInfo *)0x0) {
    ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
              ((default_delete<duckdb::BoundCreateTableInfo> *)this_00,
               (BoundCreateTableInfo *)
               __ptr_00.super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl);
  }
  if ((element_type *)local_40._0_8_ != (element_type *)0x0) {
    ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
              ((default_delete<duckdb::BoundCreateTableInfo> *)local_40,
               (BoundCreateTableInfo *)local_40._0_8_);
  }
  local_40._0_8_ = (element_type *)0x0;
  if ((CreateInfo *)local_40._8_8_ != (CreateInfo *)0x0) {
    (*((ParseInfo *)local_40._8_8_)->_vptr_ParseInfo[1])();
  }
  local_40._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return;
}

Assistant:

LogicalCreateTable::LogicalCreateTable(ClientContext &context, unique_ptr<CreateInfo> unbound_info)
    : LogicalOperator(LogicalOperatorType::LOGICAL_CREATE_TABLE),
      schema(Catalog::GetSchema(context, unbound_info->catalog, unbound_info->schema)) {
	D_ASSERT(unbound_info->type == CatalogType::TABLE_ENTRY);
	auto binder = Binder::CreateBinder(context);
	info = binder->BindCreateTableInfo(unique_ptr_cast<CreateInfo, CreateTableInfo>(std::move(unbound_info)));
}